

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.cpp
# Opt level: O0

void __thiscall
OpenMD::Field<OpenMD::Vector3<double>_>::Field
          (Field<OpenMD::Vector3<double>_> *this,SimInfo *info,string *filename,string *sele,
          RealType voxelSize)

{
  bool bVar1;
  int iVar2;
  SnapshotManager *this_00;
  Snapshot *pSVar3;
  int *piVar4;
  reference pvVar5;
  reference pvVar6;
  __normal_iterator<OpenMD::Vector3<double>_*,_std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>
  __first;
  string *in_RCX;
  undefined8 *in_RDI;
  Vector3<int> *this_01;
  double in_XMM0_Qa;
  double dVar7;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  int j;
  int i;
  RealType Wc;
  RealType Wb;
  RealType Wa;
  Vector3d CxA;
  Vector3d BxC;
  Vector3d AxB;
  Vector3d C;
  Vector3d B;
  Vector3d A;
  Mat3x3d invBox;
  Mat3x3d box;
  int nSelected;
  undefined4 in_stack_fffffffffffffba8;
  uint in_stack_fffffffffffffbac;
  Snapshot *in_stack_fffffffffffffbb0;
  __normal_iterator<OpenMD::Vector3<double>_*,_std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>
  in_stack_fffffffffffffbb8;
  StaticAnalyser *in_stack_fffffffffffffbc0;
  RectMatrix<double,_3U,_3U> *in_stack_fffffffffffffbc8;
  undefined4 in_stack_fffffffffffffbd0;
  int in_stack_fffffffffffffbd4;
  undefined4 in_stack_fffffffffffffbe8;
  undefined4 in_stack_fffffffffffffbec;
  undefined4 in_stack_fffffffffffffbf8;
  undefined4 in_stack_fffffffffffffbfc;
  undefined4 in_stack_fffffffffffffc00;
  undefined4 in_stack_fffffffffffffc04;
  Vector3<double> *in_stack_fffffffffffffc10;
  Vector3<double> *in_stack_fffffffffffffc18;
  string local_3a0 [32];
  string local_380 [32];
  double local_360;
  SimInfo *in_stack_fffffffffffffca8;
  SelectionEvaluator *in_stack_fffffffffffffcb0;
  int local_300;
  int local_2fc;
  undefined1 local_280 [48];
  undefined1 local_250 [48];
  undefined1 local_220 [120];
  SimInfo *in_stack_fffffffffffffe58;
  SelectionManager *in_stack_fffffffffffffe60;
  
  StaticAnalyser::StaticAnalyser
            (in_stack_fffffffffffffbc0,(SimInfo *)in_stack_fffffffffffffbb8._M_current,
             (string *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac);
  *in_RDI = &PTR__Field_0055f820;
  std::__cxx11::string::string((string *)(in_RDI + 0x1b),in_RCX);
  SelectionManager::SelectionManager(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  SelectionEvaluator::SelectionEvaluator(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
  in_RDI[0xe5] = in_XMM0_Qa;
  Vector3<int>::Vector3((Vector3<int> *)0x173fab);
  std::
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::vector((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
            *)0x173fc9);
  std::
  vector<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>_>_>
  ::vector((vector<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>_>_>
            *)0x173fe5);
  SelectionEvaluator::loadScriptString
            ((SelectionEvaluator *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
             (string *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
  bVar1 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0x38));
  if (!bVar1) {
    SelectionEvaluator::evaluate
              ((SelectionEvaluator *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
    SelectionManager::setSelectionSet
              ((SelectionManager *)in_stack_fffffffffffffbc0,
               (SelectionSet *)in_stack_fffffffffffffbb8._M_current);
    SelectionSet::~SelectionSet((SelectionSet *)0x174072);
  }
  iVar2 = SelectionManager::getSelectionCount((SelectionManager *)0x17412e);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x17414c);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x17415b);
  SimInfo::getSimParams((SimInfo *)in_RDI[1]);
  bVar1 = Globals::getUsePeriodicBoundaryConditions((Globals *)0x174176);
  *(bool *)(in_RDI + 0xe2) = bVar1;
  if ((*(byte *)(in_RDI + 0xe2) & 1) == 0) {
    Snapshot::getBoundingBox
              ((Snapshot *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
    SquareMatrix3<double>::operator=
              ((SquareMatrix3<double> *)in_stack_fffffffffffffbb0,
               (SquareMatrix3<double> *)
               CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x1741e0);
    Snapshot::getInvBoundingBox
              ((Snapshot *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
    SquareMatrix3<double>::operator=
              ((SquareMatrix3<double> *)in_stack_fffffffffffffbb0,
               (SquareMatrix3<double> *)
               CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x174222);
  }
  else {
    Snapshot::getHmat((Snapshot *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
    SquareMatrix3<double>::operator=
              ((SquareMatrix3<double> *)in_stack_fffffffffffffbb0,
               (SquareMatrix3<double> *)
               CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x1742e7);
    Snapshot::getInvHmat((Snapshot *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
    SquareMatrix3<double>::operator=
              ((SquareMatrix3<double> *)in_stack_fffffffffffffbb0,
               (SquareMatrix3<double> *)
               CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x174329);
  }
  this_00 = SimInfo::getSnapshotManager((SimInfo *)in_RDI[1]);
  pSVar3 = SnapshotManager::getCurrentSnapshot(this_00);
  in_RDI[0x19] = pSVar3;
  if (iVar2 == 0) {
    in_RDI[0xe4] = in_XMM0_Qa * 2.0;
  }
  else {
    in_stack_fffffffffffffc18 = (Vector3<double> *)Snapshot::getVolume(in_stack_fffffffffffffbb0);
    dVar7 = pow((double)in_stack_fffffffffffffc18 / (double)iVar2,0.3333333333333333);
    in_RDI[0xe4] = dVar7;
  }
  in_RDI[0xe3] = (double)in_RDI[0xe4] * 3.0;
  RectMatrix<double,_3U,_3U>::getColumn
            (in_stack_fffffffffffffbc8,(uint)((ulong)in_stack_fffffffffffffbc0 >> 0x20));
  Vector3<double>::Vector3
            ((Vector3<double> *)in_stack_fffffffffffffbb0,
             (Vector<double,_3U> *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
  RectMatrix<double,_3U,_3U>::getColumn
            (in_stack_fffffffffffffbc8,(uint)((ulong)in_stack_fffffffffffffbc0 >> 0x20));
  Vector3<double>::Vector3
            ((Vector3<double> *)in_stack_fffffffffffffbb0,
             (Vector<double,_3U> *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
  RectMatrix<double,_3U,_3U>::getColumn
            (in_stack_fffffffffffffbc8,(uint)((ulong)in_stack_fffffffffffffbc0 >> 0x20));
  Vector3<double>::Vector3
            ((Vector3<double> *)in_stack_fffffffffffffbb0,
             (Vector<double,_3U> *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
  cross<double>(in_stack_fffffffffffffc18,in_stack_fffffffffffffc10);
  cross<double>(in_stack_fffffffffffffc18,in_stack_fffffffffffffc10);
  cross<double>(in_stack_fffffffffffffc18,in_stack_fffffffffffffc10);
  Vector<double,_3U>::normalize((Vector<double,_3U> *)in_stack_fffffffffffffbb0);
  Vector<double,_3U>::normalize((Vector<double,_3U> *)in_stack_fffffffffffffbb0);
  Vector<double,_3U>::normalize((Vector<double,_3U> *)in_stack_fffffffffffffbb0);
  iVar2 = (int)local_220;
  dot<double,3u>((Vector<double,_3U> *)in_stack_fffffffffffffbc0,
                 &(in_stack_fffffffffffffbb8._M_current)->super_Vector<double,_3U>);
  std::abs(iVar2);
  iVar2 = (int)local_250;
  dot<double,3u>((Vector<double,_3U> *)in_stack_fffffffffffffbc0,
                 &(in_stack_fffffffffffffbb8._M_current)->super_Vector<double,_3U>);
  std::abs(iVar2);
  iVar2 = (int)local_280;
  dot<double,3u>((Vector<double,_3U> *)in_stack_fffffffffffffbc0,
                 &(in_stack_fffffffffffffbb8._M_current)->super_Vector<double,_3U>);
  std::abs(iVar2);
  iVar2 = (int)(extraout_XMM0_Qa / (double)in_RDI[0xe5]);
  this_01 = (Vector3<int> *)(in_RDI + 0xe6);
  piVar4 = Vector3<int>::x(this_01);
  *piVar4 = iVar2;
  iVar2 = (int)(extraout_XMM0_Qa_00 / (double)in_RDI[0xe5]);
  piVar4 = Vector3<int>::y(this_01);
  *piVar4 = iVar2;
  iVar2 = (int)(extraout_XMM0_Qa_01 / (double)in_RDI[0xe5]);
  piVar4 = Vector3<int>::z(this_01);
  *piVar4 = iVar2;
  Vector3<int>::x(this_01);
  std::
  vector<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>_>_>
  ::resize((vector<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>_>_>
            *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
           (size_type)in_stack_fffffffffffffbc8);
  Vector3<int>::x((Vector3<int> *)(in_RDI + 0xe6));
  std::
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::resize((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
            *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
           (size_type)in_stack_fffffffffffffbc8);
  local_2fc = 0;
  while( true ) {
    iVar2 = local_2fc;
    piVar4 = Vector3<int>::x((Vector3<int> *)(in_RDI + 0xe6));
    if (*piVar4 <= iVar2) break;
    std::
    vector<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>_>_>
    ::operator[]((vector<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>_>_>
                  *)(in_RDI + 0xeb),(long)local_2fc);
    Vector3<int>::y((Vector3<int> *)(in_RDI + 0xe6));
    std::
    vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
    ::resize((vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
              *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
             (size_type)in_stack_fffffffffffffbc8);
    std::
    vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
    ::operator[]((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                  *)(in_RDI + 0xe8),(long)local_2fc);
    Vector3<int>::y((Vector3<int> *)(in_RDI + 0xe6));
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
             (size_type)in_stack_fffffffffffffbc8);
    local_300 = 0;
    while( true ) {
      in_stack_fffffffffffffbd4 = local_300;
      piVar4 = Vector3<int>::y((Vector3<int> *)(in_RDI + 0xe6));
      if (*piVar4 <= in_stack_fffffffffffffbd4) break;
      pvVar5 = std::
               vector<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>_>_>
               ::operator[]((vector<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>_>_>
                             *)(in_RDI + 0xeb),(long)local_2fc);
      in_stack_fffffffffffffbc8 =
           (RectMatrix<double,_3U,_3U> *)
           std::
           vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
           ::operator[](pvVar5,(long)local_300);
      Vector3<int>::z((Vector3<int> *)(in_RDI + 0xe6));
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::resize
                ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                 CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                 (size_type)in_stack_fffffffffffffbc8);
      pvVar6 = std::
               vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               ::operator[]((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                             *)(in_RDI + 0xe8),(long)local_2fc);
      __first._M_current =
           (Vector3<double> *)
           std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::operator[](pvVar6,(long)local_300);
      Vector3<int>::z((Vector3<int> *)(in_RDI + 0xe6));
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                 (size_type)in_stack_fffffffffffffbc8);
      in_stack_fffffffffffffbb8._M_current = (Vector3<double> *)(in_RDI + 0xe8);
      pvVar6 = std::
               vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               ::operator[]((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                             *)in_stack_fffffffffffffbb8._M_current,(long)local_2fc);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator[](pvVar6,(long)local_300);
      std::vector<double,_std::allocator<double>_>::begin
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
      pvVar6 = std::
               vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               ::operator[]((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                             *)in_stack_fffffffffffffbb8._M_current,(long)local_2fc);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator[](pvVar6,(long)local_300);
      std::vector<double,_std::allocator<double>_>::end
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
      std::
      fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                 __first._M_current,
                 (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                 in_stack_fffffffffffffbb8._M_current,(double *)in_stack_fffffffffffffbb0);
      in_stack_fffffffffffffbb0 = (Snapshot *)(in_RDI + 0xeb);
      pvVar5 = std::
               vector<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>_>_>
               ::operator[]((vector<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>_>_>
                             *)in_stack_fffffffffffffbb0,(long)local_2fc);
      std::
      vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
      ::operator[](pvVar5,(long)local_300);
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::begin
                ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                 CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
      pvVar5 = std::
               vector<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>_>_>
               ::operator[]((vector<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>_>_>
                             *)in_stack_fffffffffffffbb0,(long)local_2fc);
      std::
      vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
      ::operator[](pvVar5,(long)local_300);
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::end
                ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                 CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
      local_360 = 0.0;
      Vector<double,_3U>::Vector((Vector<double,_3U> *)&stack0xfffffffffffffca8,&local_360);
      Vector3<double>::Vector3
                ((Vector3<double> *)in_stack_fffffffffffffbb0,
                 (Vector<double,_3U> *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8)
                );
      std::
      fill<__gnu_cxx::__normal_iterator<OpenMD::Vector3<double>*,std::vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>>>,OpenMD::Vector3<double>>
                (__first,in_stack_fffffffffffffbb8,(Vector3<double> *)in_stack_fffffffffffffbb0);
      local_300 = local_300 + 1;
    }
    local_2fc = local_2fc + 1;
  }
  getPrefix((string *)in_stack_fffffffffffffbb8._M_current);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffbb8._M_current,(char *)in_stack_fffffffffffffbb0);
  StaticAnalyser::setOutputName
            ((StaticAnalyser *)in_stack_fffffffffffffbb0,
             (string *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
  std::__cxx11::string::~string(local_380);
  std::__cxx11::string::~string(local_3a0);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x174a83);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x174a90);
  return;
}

Assistant:

Field<T>::Field(SimInfo* info, const std::string& filename,
                  const std::string& sele, RealType voxelSize) :
      StaticAnalyser(info, filename, 1),
      selectionScript_(sele), seleMan_(info), evaluator_(info),
      voxelSize_(voxelSize) {
    evaluator_.loadScriptString(sele);
    if (!evaluator_.isDynamic()) {
      seleMan_.setSelectionSet(evaluator_.evaluate());
    }

    int nSelected = seleMan_.getSelectionCount();

    Mat3x3d box;
    Mat3x3d invBox;

    usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    if (!usePeriodicBoundaryConditions_) {
      box    = snap_->getBoundingBox();
      invBox = snap_->getInvBoundingBox();
    } else {
      box    = snap_->getHmat();
      invBox = snap_->getInvHmat();
    }

    // reff will be used in the gaussian weighting of the
    // should be based on r_{effective}
    snap_ = info_->getSnapshotManager()->getCurrentSnapshot();
    if (nSelected == 0) {
      reffective_ = 2.0 * voxelSize;
    } else {
      reffective_ = pow((snap_->getVolume() / nSelected), 1. / 3.);
    }
    rcut_ = 3.0 * reffective_;

    Vector3d A = box.getColumn(0);
    Vector3d B = box.getColumn(1);
    Vector3d C = box.getColumn(2);

    // Required for triclinic cells
    Vector3d AxB = cross(A, B);
    Vector3d BxC = cross(B, C);
    Vector3d CxA = cross(C, A);

    // unit vectors perpendicular to the faces of the triclinic cell:
    AxB.normalize();
    BxC.normalize();
    CxA.normalize();

    // A set of perpendicular lengths in triclinic cells:
    RealType Wa = abs(dot(A, BxC));
    RealType Wb = abs(dot(B, CxA));
    RealType Wc = abs(dot(C, AxB));

    nBins_.x() = int(Wa / voxelSize_);
    nBins_.y() = int(Wb / voxelSize_);
    nBins_.z() = int(Wc / voxelSize_);

    // Build the field histogram and dens histogram and fill with zeros.
    field_.resize(nBins_.x());
    dens_.resize(nBins_.x());
    for (int i = 0; i < nBins_.x(); ++i) {
      field_[i].resize(nBins_.y());
      dens_[i].resize(nBins_.y());
      for (int j = 0; j < nBins_.y(); ++j) {
        field_[i][j].resize(nBins_.z());
        dens_[i][j].resize(nBins_.z());

        std::fill(dens_[i][j].begin(), dens_[i][j].end(), 0.0);
        std::fill(field_[i][j].begin(), field_[i][j].end(), T(0.0));
      }
    }

    setOutputName(getPrefix(filename) + ".field");
  }